

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_math.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  Mat4x4 prod;
  Mat4x4 tm;
  Mat4x4 m;
  Mat4x4 *mat;
  ostream *os;
  Mat4x4 *m_00;
  _Mat4x4 *this;
  Mat4x4 *in_stack_fffffffffffffe60;
  _Mat4x4 local_90;
  undefined4 local_4;
  
  local_4 = 0;
  mat = (Mat4x4 *)0x402e000000000000;
  os = (ostream *)0x4030000000000000;
  m_00 = (Mat4x4 *)0x4031000000000000;
  this = (_Mat4x4 *)0x4008000000000000;
  phyr::_Mat4x4::_Mat4x4
            (&local_90,11.0,10.0,4.0,6.0,9.0,8.0,7.0,12.0,13.0,14.0,15.0,16.0,17.0,3.0,5.0,18.0);
  std::operator<<((ostream *)&std::cout,"M:\n");
  poVar2 = phyr::operator<<(os,mat);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  phyr::_Mat4x4::inverse(in_stack_fffffffffffffe60);
  std::operator<<((ostream *)&std::cout,"\nInverse M:\n");
  poVar2 = phyr::operator<<(os,mat);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  phyr::_Mat4x4::operator*(this,m_00);
  std::operator<<((ostream *)&std::cout,"\nProduct:\n");
  std::ostream::operator<<(&std::cout,std::fixed);
  poVar2 = phyr::operator<<(os,mat);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  phyr::_Mat4x4::_Mat4x4((_Mat4x4 *)&stack0xfffffffffffffdf0);
  bVar1 = phyr::_Mat4x4::operator==(&local_90,(Mat4x4 *)&stack0xfffffffffffffdf0);
  return (uint)!bVar1;
}

Assistant:

int main(int argc, const char* argv[]) {
    phyr::Mat4x4 m(11, 10, 4, 6, 9, 8, 7, 12,
                   13, 14, 15, 16, 17, 3, 5, 18);
    std::cout << "M:\n";
    std::cout << m << std::endl;

    phyr::Mat4x4 tm = phyr::Mat4x4::inverse(m);
    std::cout << "\nInverse M:\n";
    std::cout << tm << std::endl;

    phyr::Mat4x4 prod = m * tm;
    std::cout << "\nProduct:\n";
    std::cout << std::fixed << prod << std::endl;

    return m == phyr::Mat4x4() ? 0 : 1;
}